

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O2

void wasm::Thread::mainLoop(void *self_)

{
  ThreadWorkState TVar1;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  
  do {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_40,(mutex_type *)((long)self_ + 0x10));
    if (*(long *)((long)self_ + 0x80) == 0) {
      if (*(char *)((long)self_ + 0x68) != '\0') {
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
        return;
      }
    }
    else {
      do {
        TVar1 = std::function<wasm::ThreadWorkState_()>::operator()
                          ((function<wasm::ThreadWorkState_()> *)((long)self_ + 0x70));
      } while (TVar1 == More);
      std::function<wasm::ThreadWorkState_()>::operator=
                ((function<wasm::ThreadWorkState_()> *)((long)self_ + 0x70),(nullptr_t)0x0);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    ThreadPool::notifyThreadIsReady(*self_);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_40,(mutex_type *)((long)self_ + 0x10));
    if ((*(char *)((long)self_ + 0x68) == '\0') && (*(long *)((long)self_ + 0x80) == 0)) {
      std::condition_variable::wait((unique_lock *)((long)self_ + 0x38));
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  } while( true );
}

Assistant:

void Thread::mainLoop(void* self_) {
  auto* self = static_cast<Thread*>(self_);
  while (1) {
    DEBUG_THREAD("checking for work\n");
    {
      std::unique_lock<std::mutex> lock(self->mutex);
      if (self->doWork) {
        DEBUG_THREAD("doing work\n");
        // run tasks until they are all done
        while (self->doWork() == ThreadWorkState::More) {
        }
        self->doWork = nullptr;
      } else if (self->done) {
        DEBUG_THREAD("done\n");
        return;
      }
    }
    self->parent->notifyThreadIsReady();
    {
      std::unique_lock<std::mutex> lock(self->mutex);
      if (!self->done && !self->doWork) {
        DEBUG_THREAD("thread waiting\n");
        self->condition.wait(lock);
      }
    }
  }
}